

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cartesian_cubic.hpp
# Opt level: O3

uint __thiscall sisl::cartesian_cubic<float>::linear_index(cartesian_cubic<float> *this,int d0,...)

{
  uint uVar1;
  char in_AL;
  undefined8 *puVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  long lVar3;
  undefined8 in_R8;
  void **ppvVar4;
  ulong uVar5;
  void **ppvVar6;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list vl;
  uint local_d8;
  void *local_b8 [4];
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  undefined8 local_28;
  undefined8 local_18;
  
  if (in_AL != '\0') {
    local_88 = in_XMM0_Qa;
    local_78 = in_XMM1_Qa;
    local_68 = in_XMM2_Qa;
    local_58 = in_XMM3_Qa;
    local_48 = in_XMM4_Qa;
    local_38 = in_XMM5_Qa;
    local_28 = in_XMM6_Qa;
    local_18 = in_XMM7_Qa;
  }
  ppvVar4 = &vl[0].overflow_arg_area;
  if ((uint)d0 < (this->_array)._dims[0]) {
    local_d8 = 0x10;
    lVar3 = 0;
    while( true ) {
      if (local_d8 < 0x29) {
        uVar5 = (ulong)local_d8;
        local_d8 = local_d8 + 8;
        ppvVar6 = (void **)((long)local_b8 + uVar5);
      }
      else {
        ppvVar6 = ppvVar4;
        ppvVar4 = ppvVar4 + 1;
      }
      uVar1 = (this->_array)._dims[lVar3 + 1];
      if (uVar1 <= *(uint *)ppvVar6) break;
      d0 = d0 * uVar1 + *(uint *)ppvVar6;
      lVar3 = lVar3 + 1;
      if (lVar3 == 2) {
        return d0;
      }
    }
  }
  local_b8[2] = (void *)in_RDX;
  local_b8[3] = (void *)in_RCX;
  local_98 = in_R8;
  local_90 = in_R9;
  puVar2 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar2 = "Index out of bounds!";
  __cxa_throw(puVar2,&char_const*::typeinfo,0);
}

Assistant:

virtual const unsigned int linear_index(int d0, ...) const {
            unsigned int ret = 0; va_list vl;

            va_start(vl, d0);
            ret = _array.linear_index(d0, vl);
            va_end(vl);
            return ret;
        }